

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O3

void __thiscall BufferedReader::~BufferedReader(BufferedReader *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BufferedReader::~BufferedReader()
{
    terminate();
    m_readQueue.push(0);
    join();
    for (const auto& m_reader : m_readers)
    {
        const ReaderData* pData = m_reader.second;
        delete pData;
    }
}